

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hough_approach.cpp
# Opt level: O3

vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> *
hough_approach(vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> *__return_storage_ptr__,
              Mat *img,bool debug)

{
  Size **ppSVar1;
  Mat canny_output;
  _InputArray local_b8;
  _InputArray local_98;
  Mat local_80 [96];
  
  cv::Mat::Mat(local_80);
  local_b8.sz.width = 0;
  local_b8.sz.height = 0;
  local_b8.flags = 0x1010000;
  local_98.sz.width = 0;
  local_98.sz.height = 0;
  local_98.flags = 0x2010000;
  local_b8.obj = img;
  local_98.obj = local_80;
  cv::Canny(&local_b8,(_OutputArray *)&local_98,0.0,0.0,5,false);
  if (debug) {
    ppSVar1 = (Size **)&local_b8.sz;
    local_b8._0_8_ = ppSVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Canny","");
    cv::namedWindow((string *)&local_b8,0);
    if ((Size **)local_b8._0_8_ != ppSVar1) {
      operator_delete((void *)local_b8._0_8_,(long)local_b8.sz + 1);
    }
    local_b8._0_8_ = ppSVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Canny","");
    local_98.sz.width = 0;
    local_98.sz.height = 0;
    local_98.flags = 0x1010000;
    local_98.obj = local_80;
    cv::imshow((string *)&local_b8,&local_98);
    if ((Size **)local_b8._0_8_ != ppSVar1) {
      operator_delete((void *)local_b8._0_8_,(long)local_b8.sz + 1);
    }
    cv::waitKey(0);
    cv::destroyAllWindows();
  }
  (__return_storage_ptr__->super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.sz.width = 0;
  local_b8.sz.height = 0;
  local_b8.flags = 0x1010000;
  local_98.sz.width = 0;
  local_98.sz.height = 0;
  local_98.flags = -0x7dfcffe4;
  local_b8.obj = local_80;
  local_98.obj = __return_storage_ptr__;
  cv::HoughLinesP(&local_b8,(_OutputArray *)&local_98,1.0,0.017453292519943295,100,0.0,0.0);
  cv::Mat::~Mat(local_80);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::Vec4i> hough_approach(const cv::Mat& img, bool debug)
{
    double hysteresis_threshold1 = 0;
    double hysteresis_threshold2 = 0;
    int aperture_size = 5;
    bool gradient = false;
    cv::Mat canny_output;

    cv::Canny(img, canny_output, hysteresis_threshold1, hysteresis_threshold2, aperture_size, gradient);

    if(debug)
    {
        cv::namedWindow("Canny", cv::WINDOW_NORMAL);
        cv::imshow("Canny", canny_output);
        cv::waitKey(0);
        cv::destroyAllWindows();

        // cv::Mat color_convert;
        // cv::cvtColor(canny_output, color_convert, cv::COLOR_GRAY2BGR);

        // cv::namedWindow("gray", cv::WINDOW_NORMAL);
        // cv::imshow("gray", color_convert);
        // cv::waitKey(0);
        // cv::destroyAllWindows();
    }

    std::vector<cv::Vec4i> lines;
    cv::HoughLinesP(canny_output, lines, 1, CV_PI / 180, 100, 0, 0);

    return lines;
}